

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.h
# Opt level: O0

Matrix33<double> * Imath_3_2::outerProduct<double>(Vec3<double> *a,Vec3<double> *b)

{
  double *in_RDX;
  double *in_RSI;
  Matrix33<double> *in_RDI;
  
  Matrix33<double>::Matrix33
            (in_RDI,*in_RSI * *in_RDX,*in_RSI * in_RDX[1],*in_RSI * in_RDX[2],in_RSI[1] * *in_RDX,
             in_RSI[1] * in_RDX[1],in_RSI[1] * in_RDX[2],in_RSI[2] * *in_RDX,in_RSI[2] * in_RDX[1],
             in_RSI[2] * in_RDX[2]);
  return in_RDI;
}

Assistant:

Matrix33<T>
outerProduct (const Vec3<T>& a, const Vec3<T>& b)
{
    return Matrix33<T> (
        a.x * b.x,
        a.x * b.y,
        a.x * b.z,
        a.y * b.x,
        a.y * b.y,
        a.y * b.z,
        a.z * b.x,
        a.z * b.y,
        a.z * b.z);
}